

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetGXPortStatus(ndicapi *pol,int port)

{
  int iVar1;
  unsigned_long uVar2;
  char *string;
  
  if (port - 0x31U < 3) {
    string = pol->GxStatus + (port * -2 + 0x68);
  }
  else {
    if (port - 0x41U < 3) {
      iVar1 = 0x88;
    }
    else if (port - 0x44U < 3) {
      iVar1 = 0x96;
    }
    else {
      if (2 < port - 0x47U) {
        return 0;
      }
      iVar1 = 0xa4;
    }
    string = pol->GxPassiveStatus + (uint)(iVar1 + port * -2);
  }
  uVar2 = ndiHexToUnsignedLong(string,2);
  return (int)uVar2;
}

Assistant:

ndicapiExport int ndiGetGXPortStatus(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = &pol->GxStatus[6 - 2 * (port - '1')];
  }
  else if (port >= 'A' && port <= 'C')
  {
    dp = &pol->GxPassiveStatus[6 - 2 * (port - 'A')];
  }
  else if (port >= 'D' && port <= 'F')
  {
    dp = &pol->GxPassiveStatus[14 - 2 * (port - 'D')];
  }
  else if (port >= 'G' && port <= 'I')
  {
    dp = &pol->GxPassiveStatus[22 - 2 * (port - 'G')];
  }
  else
  {
    return 0;
  }

  return (int)ndiHexToUnsignedLong(dp, 2);
}